

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test7::setInputAttributeValues(GPUShaderFP64Test7 *this,_variables *variables)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference p_Var6;
  TestError *this_00;
  undefined4 uStack_78;
  undefined4 uStack_74;
  double data [4];
  uint local_50;
  uint index;
  uint n_columns;
  uint n_components;
  uint n_total_components;
  bool is_matrix_type;
  _variable *variable;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
  local_30;
  _variables_const_iterator variable_iterator;
  uint counter;
  Functions *gl;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  variable_iterator._M_current._4_4_ = 6;
  local_30._M_current =
       (_variable *)
       std::
       vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
       ::begin(variables);
  while( true ) {
    variable = (_variable *)
               std::
               vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               ::end(variables);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
                        *)&variable);
    if (!bVar1) break;
    p_Var6 = __gnu_cxx::
             __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
             ::operator*(&local_30);
    bVar1 = Utils::isMatrixVariableType(p_Var6->type);
    index = Utils::getNumberOfComponentsForVariableType(p_Var6->type);
    local_50 = 1;
    if (bVar1) {
      local_50 = Utils::getNumberOfColumnsForVariableType(p_Var6->type);
      index = index / local_50;
    }
    for (data[3]._4_4_ = 0; data[3]._4_4_ < local_50 * p_Var6->array_size;
        data[3]._4_4_ = data[3]._4_4_ + 1) {
      data[1] = -1.0;
      data[2] = -1.0;
      uStack_78 = 0;
      uStack_74 = 0xbff00000;
      data[0]._0_4_ = 0;
      data[0]._4_4_ = 0xbff00000;
      switch(index) {
      case 1:
        (**(code **)(lVar5 + 0x1968))(p_Var6->attribute_location + data[3]._4_4_,&uStack_78);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glVertexAttrib1dv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x2873);
        break;
      case 2:
        (**(code **)(lVar5 + 0x1978))(p_Var6->attribute_location + data[3]._4_4_,&uStack_78);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glVertexAttrib2dv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x287b);
        break;
      case 3:
        (**(code **)(lVar5 + 0x1988))(p_Var6->attribute_location + data[3]._4_4_,&uStack_78);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glVertexAttrib3dv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x2883);
        break;
      case 4:
        (**(code **)(lVar5 + 0x1998))(p_Var6->attribute_location + data[3]._4_4_,&uStack_78);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glVertexAttrib4dv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                        ,0x288b);
        break;
      default:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized number of components",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x2892);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lVar5 + 0x518))(p_Var6->attribute_location + data[3]._4_4_);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glDisableVertexAttribArray() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x2898);
      variable_iterator._M_current._4_4_ = index + variable_iterator._M_current._4_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
    ::operator++(&local_30,0);
  }
  return;
}

Assistant:

void GPUShaderFP64Test7::setInputAttributeValues(const _variables& variables)
{
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();
	unsigned int		  counter = 6;

	for (_variables_const_iterator variable_iterator = variables.begin(); variable_iterator != variables.end();
		 variable_iterator++)
	{
		const _variable&   variable			  = *variable_iterator;
		const bool		   is_matrix_type	 = Utils::isMatrixVariableType(variable.type);
		const unsigned int n_total_components = Utils::getNumberOfComponentsForVariableType(variable.type);
		unsigned int	   n_components		  = 0;
		unsigned int	   n_columns		  = 1;

		if (is_matrix_type)
		{
			n_columns	= Utils::getNumberOfColumnsForVariableType(variable.type);
			n_components = n_total_components / n_columns;

			DE_ASSERT(n_total_components % n_columns == 0);
		}
		else
		{
			n_components = n_total_components;
		}

		DE_ASSERT(n_components >= 1 && n_components <= 4);

		for (unsigned int index = 0; index < n_columns * variable.array_size; ++index)
		{
			const double data[] = { -1, -1, -1, -1 };

			switch (n_components)
			{
			case 1:
			{
				gl.vertexAttribL1dv(variable.attribute_location + index, data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttrib1dv() call failed.");

				break;
			}

			case 2:
			{
				gl.vertexAttribL2dv(variable.attribute_location + index, data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttrib2dv() call failed.");

				break;
			}

			case 3:
			{
				gl.vertexAttribL3dv(variable.attribute_location + index, data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttrib3dv() call failed.");

				break;
			}

			case 4:
			{
				gl.vertexAttribL4dv(variable.attribute_location + index, data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttrib4dv() call failed.");

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized number of components");
			}
			} /* switch (n_components) */

			/* Make sure VAAs are disabled */
			gl.disableVertexAttribArray(variable.attribute_location + index);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDisableVertexAttribArray() call failed.");

			counter += n_components;
		} /* for (all array indices) */
	}	 /* for (all variables) */
}